

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O2

vector<Image,_std::allocator<Image>_> *
process_textures(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
                vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
                *tex_buf,pair<Texture,_Texture> last_batch_pair,
                vector<Image,_std::allocator<Image>_> *out_buf,Shader s,int starting_index)

{
  undefined4 uVar1;
  pointer pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Texture2D texture;
  Texture2D texture_00;
  Texture2D texture_01;
  Texture2D texture_02;
  Texture2D texture_03;
  Texture2D texture_04;
  Texture2D texture_05;
  Texture2D texture_06;
  Texture2D texture_07;
  Image image;
  Image image_00;
  Image image_01;
  RenderTexture2D target_00;
  RenderTexture2D target_01;
  RenderTexture2D target_02;
  RenderTexture2D target_03;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Texture2D texture_08;
  Texture2D texture_09;
  uint uVar19;
  int locIndex;
  ostream *poVar20;
  pointer ppVar21;
  ulong uVar22;
  int *piVar23;
  pointer ppVar24;
  Shader shader;
  Shader shader_00;
  Shader shader_01;
  undefined8 in_stack_fffffffffffffe14;
  undefined4 uStack_1e4;
  int log_index;
  uint local_1dc;
  int local_1d8;
  undefined4 uStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  Texture2D fg_previous;
  Texture local_178;
  Texture2D bg;
  Texture2D fg;
  RenderTexture2D target;
  RenderTexture2D sampler;
  Image local_48;
  
  piVar23 = s.locs;
  local_1dc = s.id;
  LoadRenderTexture(&sampler,(int)(res.x + res.x),(int)(res.y * 3.0));
  LoadRenderTexture(&target,(int)res.x,(int)res.y);
  fg_previous.format = last_batch_pair.first.format;
  fg_previous.id = last_batch_pair.first.id;
  fg_previous.width = last_batch_pair.first.width;
  fg_previous.height = last_batch_pair.first.height;
  fg_previous.mipmaps = last_batch_pair.first.mipmaps;
  local_178.format = last_batch_pair.second.format;
  local_178.id = last_batch_pair.second.id;
  local_178.width = last_batch_pair.second.width;
  local_178.height = last_batch_pair.second.height;
  local_178.mipmaps = last_batch_pair.second.mipmaps;
  ppVar24 = (tex_buf->
            super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  texture_09.id = (ppVar24->first).id;
  texture_09.width = (ppVar24->first).width;
  texture_09.height = (ppVar24->first).height;
  texture_09.mipmaps = (ppVar24->first).mipmaps;
  texture_09.format = (ppVar24->first).format;
  texture_08.id = (ppVar24->first).id;
  texture_08.width = (ppVar24->first).width;
  texture_08.height = (ppVar24->first).height;
  texture_08.mipmaps = (ppVar24->first).mipmaps;
  texture_08.format = (ppVar24->first).format;
  local_1c8 = (ppVar24->second).format;
  uVar6 = (ppVar24->second).id;
  uVar7 = (ppVar24->second).width;
  iStack_1d0 = (ppVar24->second).height;
  iStack_1cc = (ppVar24->second).mipmaps;
  log_index = starting_index;
  local_1d8 = uVar6;
  uStack_1d4 = uVar7;
  poVar20 = std::operator<<((ostream *)&std::cout,"processing inputs ");
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,starting_index);
  poVar20 = std::operator<<(poVar20," to ");
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
  std::endl<char,std::char_traits<char>>(poVar20);
  ppVar24 = (tex_buf->
            super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar24 ==
        (tex_buf->
        super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      target_00.texture.id = sampler.texture.height;
      target_00.id = sampler.texture.width;
      target_00.texture.width = sampler.texture.mipmaps;
      target_00.texture.height = sampler.texture.format;
      target_00.texture.mipmaps = sampler.depth.id;
      target_00.texture.format = sampler.depth.width;
      target_00.depth.id = sampler.depth.height;
      target_00.depth.width = sampler.depth.mipmaps;
      target_00.depth.height = sampler.depth.format;
      target_00.depth.mipmaps = (int)in_stack_fffffffffffffe14;
      target_00.depth.format = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
      UnloadRenderTexture(target_00);
      target_01.texture.id = target.texture.height;
      target_01.id = target.texture.width;
      target_01.texture.width = target.texture.mipmaps;
      target_01.texture.height = target.texture.format;
      target_01.texture.mipmaps = target.depth.id;
      target_01.texture.format = target.depth.width;
      target_01.depth.id = target.depth.height;
      target_01.depth.width = target.depth.mipmaps;
      target_01.depth.height = target.depth.format;
      target_01.depth.mipmaps = (int)in_stack_fffffffffffffe14;
      target_01.depth.format = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
      UnloadRenderTexture(target_01);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      pIVar2 = (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
      super__Vector_impl_data._M_start =
           (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
      super__Vector_impl_data._M_finish = pIVar2;
      (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    poVar20 = std::operator<<((ostream *)&std::cout,"\tprocessing ");
    poVar20 = std::operator<<(poVar20,0x30);
    *(long *)(poVar20 + *(long *)(*(long *)poVar20 + -0x18) + 0x10) = (long)digit_num;
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,log_index);
    poVar20 = std::operator<<(poVar20,"/");
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    poVar20 = std::operator<<(poVar20,"... ");
    std::endl<char,std::char_traits<char>>(poVar20);
    if (swap_fg_bg == true) {
      fg.format = (ppVar24->second).format;
      fg.id = (ppVar24->second).id;
      fg.width = (ppVar24->second).width;
      fg.height = (ppVar24->second).height;
      fg.mipmaps = (ppVar24->second).mipmaps;
      bg.format = (ppVar24->first).format;
      bg.id = (ppVar24->first).id;
      bg.width = (ppVar24->first).width;
      bg.height = (ppVar24->first).height;
      bg.mipmaps = (ppVar24->first).mipmaps;
      if (ppVar24 !=
          (tex_buf->
          super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        ppVar21 = ppVar24 + -1;
        fg_previous.format = ppVar24[-1].second.format;
        fg_previous.id = ppVar24[-1].second.id;
        fg_previous.width = ppVar24[-1].second.width;
        fg_previous.height = ppVar24[-1].second.height;
        fg_previous.mipmaps = ppVar24[-1].second.mipmaps;
LAB_0010b003:
        local_178.format = (ppVar21->first).format;
        local_178.id = (ppVar21->first).id;
        local_178.width = (ppVar21->first).width;
        local_178.height = (ppVar21->first).height;
        local_178.mipmaps = (ppVar21->first).mipmaps;
      }
    }
    else {
      fg.format = (ppVar24->first).format;
      fg.id = (ppVar24->first).id;
      fg.width = (ppVar24->first).width;
      fg.height = (ppVar24->first).height;
      fg.mipmaps = (ppVar24->first).mipmaps;
      bg.format = (ppVar24->second).format;
      bg.id = (ppVar24->second).id;
      bg.width = (ppVar24->second).width;
      bg.height = (ppVar24->second).height;
      bg.mipmaps = (ppVar24->second).mipmaps;
      if (ppVar24 !=
          (tex_buf->
          super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        fg_previous.format = ppVar24[-1].first.format;
        fg_previous.id = ppVar24[-1].first.id;
        fg_previous.width = ppVar24[-1].first.width;
        fg_previous.height = ppVar24[-1].first.height;
        fg_previous.mipmaps = ppVar24[-1].first.mipmaps;
        ppVar21 = (pointer)&ppVar24[-1].second;
        goto LAB_0010b003;
      }
    }
    pIVar2 = (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (1 < (ulong)(((long)pIVar2 -
                    (long)(out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                          super__Vector_impl_data._M_start) / 0x18)) {
      uVar3 = pIVar2[-1].format;
      uVar8 = pIVar2[-1].data;
      uVar9 = pIVar2[-1].width;
      uVar10 = pIVar2[-1].height;
      uVar11 = pIVar2[-1].mipmaps;
      image.mipmaps = uVar11;
      image.height = uVar10;
      image.width = uVar9;
      image.data = (void *)uVar8;
      image.format = uVar3;
      LoadTextureFromImage(image);
      pIVar2 = (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar22 = (ulong)num_frames_back;
      if (uVar22 < (ulong)(((long)pIVar2 -
                           (long)(out_buf->super__Vector_base<Image,_std::allocator<Image>_>).
                                 _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        uVar1 = pIVar2[-1 - uVar22].mipmaps;
        uVar4 = pIVar2[-1 - uVar22].format;
        pIVar2 = pIVar2 + (-1 - uVar22);
        uVar12 = pIVar2->data;
        uVar13 = pIVar2->width;
        uVar14 = pIVar2->height;
        image_00.height = uVar14;
        image_00.width = uVar13;
        image_00.data = (void *)uVar12;
        image_00.mipmaps = uVar1;
        image_00.format = uVar4;
        LoadTextureFromImage(image_00);
      }
      else {
        uVar5 = pIVar2[-1].format;
        uVar15 = pIVar2[-1].data;
        uVar16 = pIVar2[-1].width;
        uVar17 = pIVar2[-1].height;
        uVar18 = pIVar2[-1].mipmaps;
        image_01.mipmaps = uVar18;
        image_01.height = uVar17;
        image_01.width = uVar16;
        image_01.data = (void *)uVar15;
        image_01.format = uVar5;
        LoadTextureFromImage(image_01);
        local_1c8 = local_48.mipmaps;
        local_1d8 = (int)local_48.data;
        uStack_1d4 = (undefined4)((ulong)local_48.data >> 0x20);
        iStack_1d0 = local_48.width;
        iStack_1cc = local_48.height;
      }
    }
    target_02.texture.id = sampler.depth.width;
    target_02.id = sampler.depth.id;
    target_02.texture.width = sampler.depth.height;
    target_02.texture.height = sampler.depth.mipmaps;
    target_02.texture.mipmaps = sampler.depth.format;
    target_02.texture.format = (int)in_stack_fffffffffffffe14;
    target_02.depth.id = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
    target_02.depth.width = uStack_1e4;
    target_02.depth.height = log_index;
    target_02.depth.mipmaps = local_1dc;
    target_02.depth.format = local_1d8;
    BeginTextureMode(target_02);
    ClearBackground((Color)0xffffffff);
    texture.height = fg.height;
    texture.mipmaps = fg.mipmaps;
    texture.id = fg.id;
    texture.width = fg.width;
    texture.format = fg.format;
    DrawTexture(texture,0,0,(Color)0xffffffff);
    texture_00.height = fg_previous.height;
    texture_00.mipmaps = fg_previous.mipmaps;
    texture_00.id = fg_previous.id;
    texture_00.width = fg_previous.width;
    texture_00.format = fg_previous.format;
    DrawTexture(texture_00,(int)res.x,0,(Color)0xffffffff);
    texture_01.height = bg.height;
    texture_01.mipmaps = bg.mipmaps;
    texture_01.id = bg.id;
    texture_01.width = bg.width;
    texture_01.format = bg.format;
    DrawTexture(texture_01,0,(int)res.y,(Color)0xffffffff);
    texture_02.height = local_178.height;
    texture_02.mipmaps = local_178.mipmaps;
    texture_02.id = local_178.id;
    texture_02.width = local_178.width;
    texture_02.format = local_178.format;
    DrawTexture(texture_02,(int)res.x,(int)res.y,(Color)0xffffffff);
    DrawTexture(texture_08,0,(int)(res.y + res.y),(Color)0xffffffff);
    texture_03.width = uStack_1d4;
    texture_03.id = local_1d8;
    texture_03.height = iStack_1d0;
    texture_03.mipmaps = iStack_1cc;
    texture_03.format = local_1c8;
    DrawTexture(texture_03,(int)res.x,(int)(res.y + res.y),(Color)0xffffffff);
    EndTextureMode();
    UnloadTexture(texture_09);
    texture_04.width = uStack_1d4;
    texture_04.id = local_1d8;
    texture_04.height = iStack_1d0;
    texture_04.mipmaps = iStack_1cc;
    texture_04.format = local_1c8;
    UnloadTexture(texture_04);
    uVar19 = local_1dc;
    shader._4_4_ = 0;
    shader.id = local_1dc;
    shader.locs = piVar23;
    locIndex = GetShaderLocation(shader,"progress");
    shader_00._4_4_ = 0;
    shader_00.id = uVar19;
    shader_00.locs = piVar23;
    SetShaderValue(shader_00,locIndex,&log_index,4);
    target_03.texture.id = target.depth.width;
    target_03.id = target.depth.id;
    target_03.texture.width = target.depth.height;
    target_03.texture.height = target.depth.mipmaps;
    target_03.texture.mipmaps = target.depth.format;
    target_03.texture.format = (int)in_stack_fffffffffffffe14;
    target_03.depth.id = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
    target_03.depth.width = uStack_1e4;
    target_03.depth.height = log_index;
    target_03.depth.mipmaps = local_1dc;
    target_03.depth.format = local_1d8;
    BeginTextureMode(target_03);
    ClearBackground((Color)0xffffffff);
    shader_01._4_4_ = 0;
    shader_01.id = uVar19;
    shader_01.locs = piVar23;
    BeginShaderMode(shader_01);
    texture_05.width = sampler.texture.width;
    texture_05.id = sampler.texture.id;
    texture_05.mipmaps = sampler.texture.mipmaps;
    texture_05.height = sampler.texture.height;
    texture_05.format = sampler.texture.format;
    DrawTexture(texture_05,0,0,(Color)0xffffffff);
    EndShaderMode();
    EndTextureMode();
    texture_06.width = target.texture.width;
    texture_06.id = target.texture.id;
    texture_06.mipmaps = target.texture.mipmaps;
    texture_06.height = target.texture.height;
    texture_06.format = target.texture.format;
    GetTextureData(texture_06);
    std::vector<Image,_std::allocator<Image>_>::emplace_back<Image>(out_buf,&local_48);
    BeginDrawing();
    texture_07.width = target.texture.width;
    texture_07.id = target.texture.id;
    texture_07.mipmaps = target.texture.mipmaps;
    texture_07.height = target.texture.height;
    texture_07.format = target.texture.format;
    DrawTexture(texture_07,0,0,(Color)0xffffffff);
    EndDrawing();
    log_index = log_index + 1;
    ppVar24 = ppVar24 + 1;
  } while( true );
}

Assistant:

std::vector<Image> process_textures(
	std::vector<std::pair<Texture2D,Texture2D>> tex_buf,
	std::pair<Texture2D,Texture2D> last_batch_pair,
	std::vector<Image> out_buf,
	Shader s,
	int starting_index)
{

	// Create a RenderTexture2D to use as a canvas
    RenderTexture2D sampler = LoadRenderTexture(res.x*2, res.y*3);
	RenderTexture2D target = LoadRenderTexture(res.x, res.y);
	
	//iterate through all the textures in the vector
	int log_index = starting_index;
	Texture2D fg, bg;
	Texture2D fg_previous = last_batch_pair.first;
	Texture2D bg_previous = last_batch_pair.second;
	Texture2D processed_previous = tex_buf.front().first;
	Texture2D processed_older = tex_buf.front().second;

	std::cout << "processing inputs " << starting_index
		<< " to " << (starting_index+tex_buf.size()) << std::endl;
	for (auto it = tex_buf.begin(); it != tex_buf.end(); ++it) {
		std::cout << "\tprocessing "
			<< std::setfill('0') << std::setw(digit_num) << log_index
			<< "/" << out_buf.size() << "... " << std::endl;

		if (swap_fg_bg) {
			fg = it->second;
			bg = it->first;
			if (it != tex_buf.begin()) {
				fg_previous = (it-1)->second;
				bg_previous = (it-1)->first;
			}
		} else {
			fg = it->first;
			bg = it->second;
			if (it != tex_buf.begin()) {
				fg_previous = (it-1)->first;
				bg_previous = (it-1)->second;
			}
		}


		if (out_buf.size() > 1) {
			processed_previous = LoadTextureFromImage(*(out_buf.end()-1));
			//if num_frames_back > out.size,
			//return the texture using modulo operation
			if (out_buf.size() > num_frames_back) {
				processed_older
					= LoadTextureFromImage(*(out_buf.end()-1-num_frames_back));
			} else processed_older = LoadTextureFromImage(out_buf.back());
		}

		/* raylib doesn't allow uploading sampler2Ds to GPU.
		 * so instead, I draw the necessary textures to a very tall render
		 * texture called "sampler with textures arranged like this:
		 * 		current foreground texture	|	previous foreground texture
		 * 		current background texture	|	previous background texture
		 * 		previous processed texture	|	older processed texture
		 */
		BeginTextureMode(sampler);
			ClearBackground(WHITE);
			DrawTexture(fg, 				0, 		0, 			WHITE);
			DrawTexture(fg_previous, 		res.x, 	0, 			WHITE);
			DrawTexture(bg, 				0, 		res.y,		WHITE);
			DrawTexture(bg_previous,		res.x,	res.y,		WHITE);
			DrawTexture(processed_previous,	0,		res.y*2,	WHITE);
			DrawTexture(processed_older,	res.x,	res.y*2,	WHITE);
		EndTextureMode();
		
		//unload the temporary textures
		UnloadTexture(processed_previous);
		UnloadTexture(processed_older);

		SetShaderValue(
			s,
			GetShaderLocation(s, "progress"),
			&log_index,
			SHADER_UNIFORM_INT
		);

		//now apply the shader and render to target texture
		BeginTextureMode(target);
			ClearBackground(WHITE);
			BeginShaderMode(s);
				DrawTexture(sampler.texture, 0, 0, WHITE);
			EndShaderMode();
		EndTextureMode();

		out_buf.push_back(GetTextureData(target.texture));
		
		//finally, draw on the screen
		BeginDrawing();
			DrawTexture(target.texture, 0, 0, WHITE);
		EndDrawing();

		++log_index;
	}

	UnloadRenderTexture(sampler);
	UnloadRenderTexture(target);

	std::cout << std::endl;
	return out_buf;
}